

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

bool __thiscall
sptk::Matrix::GetSubmatrix
          (Matrix *this,int row_offset,int num_row_of_submatrix,int column_offset,
          int num_column_of_submatrix,Matrix *submatrix)

{
  pointer ppdVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (num_row_of_submatrix < 1 || row_offset < 0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    if (((0 < num_column_of_submatrix) && (bVar4 = false, -1 < column_offset)) &&
       (num_row_of_submatrix + row_offset <= this->num_row_)) {
      bVar4 = false;
      if (((this != submatrix) && (submatrix != (Matrix *)0x0)) &&
         (bVar4 = false, num_column_of_submatrix + column_offset <= this->num_column_)) {
        if ((submatrix->num_row_ != num_row_of_submatrix) ||
           (submatrix->num_column_ != num_column_of_submatrix)) {
          Resize(submatrix,num_row_of_submatrix,num_column_of_submatrix);
        }
        bVar4 = true;
        if (0 < num_row_of_submatrix) {
          ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar5 = 0;
          do {
            if (0 < num_column_of_submatrix) {
              pdVar2 = (submatrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar5];
              pdVar3 = ppdVar1[(uint)row_offset + uVar5];
              uVar6 = 0;
              do {
                pdVar2[uVar6] = pdVar3[(uint)column_offset + uVar6];
                uVar6 = uVar6 + 1;
              } while ((uint)num_column_of_submatrix != uVar6);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != (uint)num_row_of_submatrix);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool Matrix::GetSubmatrix(int row_offset, int num_row_of_submatrix,
                          int column_offset, int num_column_of_submatrix,
                          Matrix* submatrix) const {
  if (row_offset < 0 || num_row_of_submatrix <= 0 ||
      num_row_ < row_offset + num_row_of_submatrix || column_offset < 0 ||
      num_column_of_submatrix <= 0 ||
      num_column_ < column_offset + num_column_of_submatrix ||
      NULL == submatrix || this == submatrix) {
    return false;
  }

  if (submatrix->num_row_ != num_row_of_submatrix ||
      submatrix->num_column_ != num_column_of_submatrix) {
    submatrix->Resize(num_row_of_submatrix, num_column_of_submatrix);
  }

  for (int i(0); i < num_row_of_submatrix; ++i) {
    for (int j(0); j < num_column_of_submatrix; ++j) {
      submatrix->index_[i][j] = index_[row_offset + i][column_offset + j];
    }
  }

  return true;
}